

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printHex(uchar *value,int len)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  char buf [3];
  
  __s = ByteToHex(value,len);
  sVar1 = strlen(__s);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  uVar3 = sVar1 >> 1 & 0xffffffff;
  if ((int)(sVar1 >> 1) < 1) {
    uVar3 = 0;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    buf[1] = __s[uVar2 * 2 + 1];
    buf[0] = __s[uVar2 * 2];
    printf("%s ",buf);
  }
  putchar(10);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void printHex(const unsigned char* value, const int len)
{
	char* data = ByteToHex(value, len);
	int strl = strlen(data) / 2;
	char buf[3] = { 0 };
	for (int i = 0; i < strl; ++i)
	{
		buf[0] = data[i * 2];
		buf[1] = data[i * 2 + 1];
		printf("%s ", buf);
	}
	printf("\n");
	delete[]data;
}